

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::IOBlock::declareArray
          (string *__return_storage_ptr__,IOBlock *this,string *sizeExpr)

{
  int iVar1;
  ostream *poVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference name;
  DeclareVariable local_1e8;
  int local_1a8;
  int i;
  ostringstream local_198 [8];
  ostringstream buf;
  string *sizeExpr_local;
  IOBlock *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,(string *)&this->m_blockName);
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"{\n");
  local_1a8 = 0;
  while( true ) {
    iVar1 = local_1a8;
    sVar3 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
            ::size(&this->m_members);
    if ((int)sVar3 <= iVar1) break;
    poVar2 = std::operator<<((ostream *)local_198,"\t");
    pvVar4 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
             ::operator[](&this->m_members,(long)local_1a8);
    name = std::
           vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
           ::operator[](&this->m_members,(long)local_1a8);
    glu::declare(&local_1e8,&pvVar4->type,&name->name,0);
    poVar2 = glu::decl::operator<<(poVar2,&local_1e8);
    std::operator<<(poVar2,";\n");
    glu::decl::DeclareVariable::~DeclareVariable(&local_1e8);
    local_1a8 = local_1a8 + 1;
  }
  poVar2 = std::operator<<((ostream *)local_198,"} ");
  poVar2 = std::operator<<(poVar2,(string *)&this->m_interfaceName);
  poVar2 = std::operator<<(poVar2,"[");
  poVar2 = std::operator<<(poVar2,(string *)sizeExpr);
  std::operator<<(poVar2,"];\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::IOBlock::declareArray (const string& sizeExpr) const
{
	std::ostringstream buf;

	buf << m_blockName << "\n"
		<< "{\n";

	for (int i = 0; i < (int)m_members.size(); i++)
		buf << "\t" << glu::declare(m_members[i].type, m_members[i].name) << ";\n";

	buf << "} " << m_interfaceName << "[" << sizeExpr << "];\n";
	return buf.str();
}